

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-again.c
# Opt level: O2

void repeat_2_cb(uv_timer_t *handle)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_20;
  
  pFVar1 = _stderr;
  if (handle == &repeat_2) {
    if (repeat_2_cb_allowed == '\0') {
      pcVar5 = "repeat_2_cb_allowed";
      uStack_20 = 0x47;
    }
    else {
      uVar3 = uv_default_loop();
      lVar4 = uv_now(uVar3);
      fprintf(pFVar1,"repeat_2_cb called after %ld ms\n",lVar4 - start_time);
      fflush(_stderr);
      repeat_2_cb_called = repeat_2_cb_called + 1;
      lVar4 = uv_timer_get_repeat(&repeat_2);
      pFVar1 = _stderr;
      if (lVar4 == 0) {
        iVar2 = uv_is_active(&repeat_2);
        if (iVar2 == 0) {
          uv_close(&repeat_2,close_cb);
          return;
        }
        pcVar5 = "0 == uv_is_active((uv_handle_t*) handle)";
        uStack_20 = 0x50;
      }
      else {
        uVar3 = uv_timer_get_repeat(&repeat_2);
        fprintf(pFVar1,"uv_timer_get_repeat %ld ms\n",uVar3);
        fflush(_stderr);
        lVar4 = uv_timer_get_repeat(&repeat_2);
        if (lVar4 == 100) {
          uv_timer_set_repeat(&repeat_2,0);
          return;
        }
        pcVar5 = "uv_timer_get_repeat(&repeat_2) == 100";
        uStack_20 = 0x58;
      }
    }
  }
  else {
    pcVar5 = "handle == &repeat_2";
    uStack_20 = 0x46;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
          ,uStack_20,pcVar5);
  abort();
}

Assistant:

static void repeat_2_cb(uv_timer_t* handle) {
  ASSERT(handle == &repeat_2);
  ASSERT(repeat_2_cb_allowed);

  fprintf(stderr, "repeat_2_cb called after %ld ms\n",
          (long int)(uv_now(uv_default_loop()) - start_time));
  fflush(stderr);

  repeat_2_cb_called++;

  if (uv_timer_get_repeat(&repeat_2) == 0) {
    ASSERT(0 == uv_is_active((uv_handle_t*) handle));
    uv_close((uv_handle_t*)handle, close_cb);
    return;
  }

  fprintf(stderr, "uv_timer_get_repeat %ld ms\n",
          (long int)uv_timer_get_repeat(&repeat_2));
  fflush(stderr);
  ASSERT(uv_timer_get_repeat(&repeat_2) == 100);

  /* This shouldn't take effect immediately. */
  uv_timer_set_repeat(&repeat_2, 0);
}